

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

void av1_rd_pick_intra_mode_sb
               (AV1_COMP *cpi,macroblock *x,RD_STATS *rd_cost,BLOCK_SIZE bsize,
               PICK_MODE_CONTEXT *ctx,int64_t best_rd)

{
  AV1_COMMON *cm;
  CANDIDATE_MV *pCVar1;
  uint8_t uVar2;
  TX_SIZE_SEARCH_METHOD TVar3;
  char cVar4;
  int mi_row;
  int mi_col;
  int iVar5;
  byte bVar6;
  MB_RD_RECORD *pMVar7;
  MB_MODE_INFO *pMVar8;
  MB_MODE_INFO *pMVar9;
  SequenceHeader *pSVar10;
  IntraBCMVCosts *dv_costs;
  BLOCK_SIZE bsize_00;
  CANDIDATE_MV CVar11;
  CANDIDATE_MV CVar12;
  CANDIDATE_MV CVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  int iVar20;
  int64_t iVar21;
  long lVar22;
  buf_2d *pbVar23;
  TX_MODE TVar24;
  byte bVar25;
  uint uVar26;
  int iVar27;
  size_t __n;
  int iVar28;
  char cVar29;
  byte bVar30;
  int iVar31;
  int iVar32;
  IntrabcMotionDirection dir;
  uint uVar33;
  ulong uVar34;
  bool bVar35;
  int_mv local_be4;
  uint8_t uv_skip_txfm;
  MV dv;
  uint local_bd0;
  int_mv best_mv;
  int_mv nearmv;
  uint8_t y_skip_txfm;
  MB_MODE_INFO *local_bb8;
  int local_bac;
  int rate_uv;
  int_mv nearestmv;
  long local_ba0;
  ulong local_b98;
  MACROBLOCKD *local_b90;
  MB_MODE_INFO_EXT *local_b88;
  ulong local_b80;
  int local_b74;
  int local_b70;
  FULLPEL_MV local_b6c;
  int local_b68;
  int rate_uv_tokenonly;
  int rate_y;
  int_mv best_hash_mv;
  uint8_t *local_b58;
  long local_b50;
  ulong local_b48;
  int64_t dist_uv;
  ulong local_b38;
  ulong local_b30;
  int **local_b28;
  PALETTE_MODE_INFO *local_b20;
  IntraBCMVCosts *local_b18;
  AV1_COMMON *local_b10;
  ulong local_b08;
  ulong local_b00;
  IntraBCHashInfo *local_af8;
  MB_MODE_INFO *local_af0;
  int64_t dist_y;
  int rate_y_tokenonly;
  RD_STATS best_rdstats;
  RD_STATS rd_stats_yuv;
  FULLPEL_MOTION_SEARCH_PARAMS local_a88;
  FULLPEL_MV_STATS best_mv_stats;
  buf_2d yv12_mb [3];
  RD_STATS local_938;
  RD_STATS rd_stats_y;
  MB_MODE_INFO best_mbmi;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  
  local_af0 = *(x->e_mbd).mi;
  uVar2 = ((cpi->common).seq_params)->monochrome;
  uVar33 = 0;
  rate_y = 0;
  rate_uv = 0;
  rate_y_tokenonly = 0;
  rate_uv_tokenonly = 0;
  y_skip_txfm = '\0';
  uv_skip_txfm = '\0';
  dist_y = 0;
  dist_uv = 0;
  (ctx->rd_stats).skip_txfm = '\0';
  local_af0->ref_frame[0] = '\0';
  local_af0->ref_frame[1] = -1;
  local_af0->mv[0].as_int = 0;
  local_af0->field_0xa7 = local_af0->field_0xa7 & 0x3f;
  iVar21 = av1_rd_pick_intra_sby_mode
                     (cpi,x,&rate_y,&rate_y_tokenonly,&dist_y,&y_skip_txfm,bsize,best_rd,ctx);
  bVar35 = (cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;
  (x->txfm_search_params).use_qm_dist_metric = (uint)bVar35;
  (x->txfm_search_params).use_default_intra_tx_type = 0;
  (x->txfm_search_params).default_inter_tx_type_prob_thresh = 0x7fffffff;
  (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[0];
  (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[0];
  if (bVar35) {
    (x->txfm_search_params).use_transform_domain_distortion = 1;
  }
  else {
    (x->txfm_search_params).use_transform_domain_distortion =
         (cpi->winner_mode_params).use_transform_domain_distortion[0];
    uVar33 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
  }
  (x->txfm_search_params).tx_domain_dist_threshold = uVar33;
  (x->txfm_search_params).coeff_opt_thresholds[0] =
       (cpi->winner_mode_params).coeff_opt_thresholds[0][0];
  (x->txfm_search_params).coeff_opt_thresholds[1] =
       (cpi->winner_mode_params).coeff_opt_thresholds[0][1];
  TVar3 = (cpi->winner_mode_params).tx_size_search_methods[0];
  (x->txfm_search_params).tx_size_search_method = TVar3;
  TVar24 = '\0';
  if ((cpi->common).features.coded_lossless == false) {
    TVar24 = '\x02' - (TVar3 == '\x02');
  }
  (x->txfm_search_params).tx_mode_search_type = TVar24;
  (x->txfm_search_params).prune_2d_txfm_mode =
       (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
  if (((x->txfm_search_params).mode_eval_type != 0) &&
     (pMVar7 = (x->txfm_search_info).mb_rd_record, pMVar7 != (MB_RD_RECORD *)0x0)) {
    pMVar7->index_start = 0;
    pMVar7->num = 0;
  }
  (x->txfm_search_params).mode_eval_type = 0;
  if (best_rd <= iVar21) {
    rd_cost->rate = 0x7fffffff;
    goto LAB_0020eb69;
  }
  if (uVar2 == '\0') {
    if ((x->e_mbd).is_chroma_ref == true) {
      if (((cpi->common).seq_params)->monochrome == '\0') {
        pMVar8 = *(x->e_mbd).mi;
        uVar34 = (ulong)pMVar8->bsize;
        if ((x->e_mbd).lossless[*(ushort *)&pMVar8->field_0xa7 & 7] == 0) {
          bVar35 = (0x2f0bffUL >> (uVar34 & 0x3f) & 1) != 0;
          if ((0x1f07ffUL >> (uVar34 & 0x3f) & 1) == 0) {
            bVar35 = false;
          }
        }
        else {
          bVar35 = av1_ss_size_lookup[uVar34][(x->e_mbd).plane[1].subsampling_x]
                   [(x->e_mbd).plane[1].subsampling_y] == BLOCK_4X4;
        }
      }
      else {
        bVar35 = false;
      }
      if (bVar35) {
        memcpy((x->txfm_search_info).blk_skip,ctx->blk_skip,(long)ctx->num_4x4_blk);
        memcpy((x->e_mbd).tx_type_map,ctx->tx_type_map,(long)ctx->num_4x4_blk);
      }
    }
    pMVar8 = *(x->e_mbd).mi;
    if ((x->e_mbd).lossless[*(ushort *)&pMVar8->field_0xa7 & 7] == 0) {
      bVar30 = ""[av1_ss_size_lookup[pMVar8->bsize][(x->e_mbd).plane[1].subsampling_x]
                  [(x->e_mbd).plane[1].subsampling_y]];
      if (bVar30 < 0x11) {
        bVar25 = 3;
        if ((1 < bVar30 - 0xb) && (bVar30 != 4)) {
LAB_0020ede4:
          bVar25 = bVar30;
        }
      }
      else if (bVar30 == 0x11) {
        bVar25 = 9;
      }
      else {
        if (bVar30 != 0x12) goto LAB_0020ede4;
        bVar25 = 10;
      }
    }
    else {
      bVar25 = 0;
    }
    av1_rd_pick_intra_sbuv_mode
              (cpi,x,&rate_uv,&rate_uv_tokenonly,&dist_uv,&uv_skip_txfm,bsize,bVar25);
  }
  pMVar8 = (x->e_mbd).left_mbmi;
  pMVar9 = (x->e_mbd).above_mbmi;
  if (pMVar9 == (MB_MODE_INFO *)0x0) {
    uVar33 = 0;
  }
  else {
    uVar33 = (uint)pMVar9->skip_txfm;
  }
  if (pMVar8 == (MB_MODE_INFO *)0x0) {
    uVar26 = 0;
  }
  else {
    uVar26 = (uint)pMVar8->skip_txfm;
  }
  lVar22 = (long)rate_uv + (long)rate_y + (long)(x->mode_costs).skip_txfm_cost[uVar26 + uVar33][0];
  rd_cost->rate = (int)lVar22;
  rd_cost->dist = dist_uv + dist_y;
  rd_cost->rdcost = (dist_uv + dist_y) * 0x80 + (x->rdmult * lVar22 + 0x100 >> 9);
  rd_cost->skip_txfm = '\0';
LAB_0020eb69:
  cm = &cpi->common;
  if ((rd_cost->rate != 0x7fffffff) && (rd_cost->rdcost < best_rd)) {
    best_rd = rd_cost->rdcost;
  }
  lVar22 = 0x7fffffffffffffff;
  if (((((((cm->current_frame).frame_type & 0xfd) == 0) &&
        ((cpi->common).features.allow_screen_content_tools == true)) &&
       ((cpi->common).features.allow_intrabc != false)) &&
      (((cpi->oxcf).kf_cfg.enable_intrabc == true && ((cpi->sf).mv_sf.use_intrabc != 0)))) &&
     ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) {
    pSVar10 = (cpi->common).seq_params;
    uVar2 = pSVar10->monochrome;
    local_b90 = &x->e_mbd;
    local_bb8 = *(x->e_mbd).mi;
    mi_row = (x->e_mbd).mi_row;
    mi_col = (x->e_mbd).mi_col;
    local_b98 = (ulong)bsize;
    bVar30 = block_size_wide[local_b98];
    bVar25 = (byte)pSVar10->mib_size_log2;
    local_b48 = (ulong)(uint)(mi_row >> (bVar25 & 0x1f));
    local_b68 = mi_col >> (bVar25 & 0x1f);
    local_b80 = (ulong)block_size_high[local_b98];
    local_b88 = &x->mbmi_ext;
    local_b50 = best_rd;
    local_b10 = cm;
    av1_find_mv_refs(cm,local_b90,local_bb8,'\0',(x->mbmi_ext).ref_mv_count,(x->e_mbd).ref_mv_stack,
                     (x->e_mbd).weight,(int_mv (*) [2])0x0,(x->mbmi_ext).global_mvs,
                     (x->mbmi_ext).mode_context);
    (x->mbmi_ext).weight[0] = *(uint16_t (*) [4])(x->e_mbd).weight[0];
    CVar11 = (x->e_mbd).ref_mv_stack[0][1];
    CVar12 = (x->e_mbd).ref_mv_stack[0][2];
    CVar13 = (x->e_mbd).ref_mv_stack[0][3];
    (x->mbmi_ext).ref_mv_stack[0][0] = (x->e_mbd).ref_mv_stack[0][0];
    (x->mbmi_ext).ref_mv_stack[0][1] = CVar11;
    (x->mbmi_ext).ref_mv_stack[0][2] = CVar12;
    (x->mbmi_ext).ref_mv_stack[0][3] = CVar13;
    av1_find_best_ref_mvs_from_stack(0,local_b88,'\0',&nearestmv,&nearmv,0);
    if (nearestmv.as_int == 0x80008000) {
      nearestmv.as_int = 0;
    }
    if (nearmv.as_int == 0x80008000) {
      nearmv.as_int = 0;
    }
    local_be4 = nearestmv;
    if (nearestmv.as_int == 0) {
      local_be4 = nearmv;
    }
    iVar27 = (uint)(uVar2 == '\0') * 2 + 1;
    if ((MV)local_be4.as_int == (MV)0x0) {
      iVar19 = ((cpi->common).seq_params)->mib_size;
      if (mi_row - iVar19 < (x->e_mbd).tile.mi_row_start) {
        local_be4.as_mv.row = 0;
        iVar19 = iVar19 * -4 + -0x100;
      }
      else {
        local_be4.as_mv.row = -(short)(iVar19 << 2);
        iVar19 = 0;
      }
      local_be4.as_mv.col = 0;
      local_be4.as_int = iVar19 * 0x80000 + (local_be4.as_int & 0x1fff) * 8;
    }
    (x->mbmi_ext).ref_mv_stack[0][0].this_mv.as_mv = (MV)local_be4;
    uVar34 = 0;
    av1_setup_pred_block
              (local_b90,yv12_mb,(x->e_mbd).cur_buf,(scale_factors *)0x0,(scale_factors *)0x0,iVar27
              );
    pbVar23 = (x->e_mbd).plane[0].pre;
    do {
      puVar14 = *(uint8_t **)((long)&yv12_mb[0].buf + uVar34);
      puVar15 = *(uint8_t **)((long)&yv12_mb[0].buf0 + uVar34);
      uVar16 = *(undefined8 *)((long)&yv12_mb[0].width + uVar34);
      uVar17 = *(undefined8 *)((long)&yv12_mb[0].stride + uVar34);
      pbVar23->width = (int)uVar16;
      pbVar23->height = (int)((ulong)uVar16 >> 0x20);
      *(undefined8 *)&pbVar23->stride = uVar17;
      pbVar23->buf = puVar14;
      pbVar23->buf0 = puVar15;
      uVar34 = uVar34 + 0x20;
      pbVar23 = (buf_2d *)((long)(pbVar23 + 0x51) + 0x10);
    } while ((uint)(iVar27 * 0x20) != uVar34);
    memcpy(&best_mbmi,local_bb8,0xb0);
    best_rdstats.skip_txfm = rd_cost->skip_txfm;
    best_rdstats._33_7_ = *(undefined7 *)&rd_cost->field_0x21;
    best_rdstats.rate = rd_cost->rate;
    best_rdstats.zero_rate = rd_cost->zero_rate;
    best_rdstats.dist = rd_cost->dist;
    best_rdstats.rdcost = rd_cost->rdcost;
    best_rdstats.sse = rd_cost->sse;
    memset(best_blk_skip,0,0x400);
    memcpy(best_tx_type_map,(x->e_mbd).tx_type_map,(long)ctx->num_4x4_blk);
    bVar25 = (cpi->sf).mv_sf.search_method;
    iVar27 = (cpi->sf).mv_sf.use_bsize_dependent_search_method;
    bVar6 = (byte)local_b80;
    if (bVar30 < (byte)local_b80) {
      bVar6 = bVar30;
    }
    if ((0x1f < bVar6 && iVar27 == 1) ||
       (((0xf < bVar6 && 1 < iVar27 && ((x->content_state_sb).source_sad_nonrd < kHighSad)) &&
        (x->qindex < 0xc0)))) {
      if (bVar25 < 0xb) {
        bVar25 = (&DAT_005095e8)[bVar25];
      }
      else {
        bVar25 = 0;
      }
    }
    local_b6c = (FULLPEL_MV)
                (((int)local_be4.as_mv.row - (~(int)local_be4.as_mv.row >> 0x1f)) + 3U >> 3 & 0xffff
                | ((int)local_be4.as_mv.col - (~(int)local_be4.as_mv.col >> 0x1f)) * 0x2000 +
                  0x6000U & 0xffff0000);
    av1_make_default_fullpel_ms_params
              (&local_a88,cpi,x,(BLOCK_SIZE)local_b98,&local_be4.as_mv,local_b6c,
               (cpi->mv_search_params).search_site_cfg[1],bVar25,0);
    dv_costs = x->dv_costs;
    av1_set_ms_to_intra_mode(&local_a88,dv_costs);
    local_b88 = (MB_MODE_INFO_EXT *)CONCAT44(local_b88._4_4_,(int)local_b48 + 1);
    local_af8 = &x->intrabc_hash_info;
    local_b70 = mi_row << 5;
    local_b74 = mi_col << 5;
    local_b30 = 0x10003L >> ((byte)local_b98 & 0x3f);
    local_b00 = (ulong)(uint)((int)local_b80 * 8);
    local_b08 = (ulong)((uint)bVar30 * 8);
    local_b38 = 0x20005L >> ((byte)local_b98 & 0x3f);
    local_bac = (mi_col >> 4) + -4;
    local_b20 = &local_bb8->palette_mode_info;
    local_b28 = dv_costs->dv_costs;
    local_b58 = (x->txfm_search_info).blk_skip;
    local_ba0 = local_b50;
    uVar33 = 0;
    local_b18 = dv_costs;
    do {
      local_a88.mv_limits.col_min = ((x->e_mbd).tile.mi_col_start - mi_col) * 4;
      local_bd0 = (uint)bVar30;
      if ((uVar33 & 1) == 0) {
        local_a88.mv_limits.col_max = ((x->e_mbd).tile.mi_col_end - mi_col) * 4 - local_bd0;
        local_a88.mv_limits.row_min = (x->e_mbd).tile.mi_row_start - mi_row;
        iVar27 = ((cpi->common).seq_params)->mib_size * (int)local_b48;
      }
      else {
        iVar27 = ((cpi->common).seq_params)->mib_size;
        local_a88.mv_limits.col_max = (iVar27 * local_b68 - mi_col) * 4 - local_bd0;
        local_a88.mv_limits.row_min = (x->e_mbd).tile.mi_row_start - mi_row;
        iVar27 = iVar27 * (int)local_b88;
        iVar19 = (x->e_mbd).tile.mi_row_end;
        if (iVar19 <= iVar27) {
          iVar27 = iVar19;
        }
      }
      local_a88.mv_limits.row_min = local_a88.mv_limits.row_min * 4;
      local_a88.mv_limits.row_max = (iVar27 - mi_row) * 4 - (int)local_b80;
      av1_set_mv_search_range(&local_a88.mv_limits,&local_be4.as_mv);
      if ((local_a88.mv_limits.col_min <= local_a88.mv_limits.col_max) &&
         (local_a88.mv_limits.row_min <= local_a88.mv_limits.row_max)) {
        iVar27 = av1_full_pixel_search
                           (local_b6c,&local_a88,(cpi->mv_search_params).mv_step_param,(int *)0x0,
                            &best_mv.as_fullmv,&best_mv_stats,(FULLPEL_MV *)0x0);
        iVar19 = av1_intrabc_hash_search(cpi,local_b90,&local_a88,local_af8,&best_hash_mv.as_fullmv)
        ;
        if (iVar19 < iVar27) {
          best_mv = best_hash_mv;
          iVar27 = iVar19;
        }
        if (iVar27 != 0x7fffffff) {
          dv = (MV)((best_mv.as_int >> 0x10) * 0x80000 + (best_mv.as_int & 0x1fff) * 8);
          iVar27 = ((int)dv.col - (~(int)dv.col >> 0x1f)) + 3 >> 3;
          if ((local_a88.mv_limits.col_min <= iVar27) && (iVar27 <= local_a88.mv_limits.col_max)) {
            iVar27 = ((int)dv.row - (~(int)dv.row >> 0x1f)) + 3 >> 3;
            if ((local_a88.mv_limits.row_min <= iVar27) &&
               ((iVar27 <= local_a88.mv_limits.row_max && (((uint)dv & 0x70000) == 0)))) {
              iVar27 = dv.row + local_b70;
              iVar19 = (x->e_mbd).tile.mi_row_start * 0x20;
              if (iVar19 <= iVar27) {
                iVar31 = ((int)dv >> 0x10) + local_b74;
                uVar26 = (x->e_mbd).tile.mi_col_start;
                iVar32 = uVar26 * 0x20;
                if ((iVar32 <= iVar31) &&
                   (iVar20 = (int)local_b00 + iVar27, iVar20 <= (x->e_mbd).tile.mi_row_end * 0x20))
                {
                  iVar28 = iVar31 + (int)local_b08;
                  iVar5 = (x->e_mbd).tile.mi_col_end;
                  if (iVar28 <= iVar5 * 0x20) {
                    pSVar10 = (cpi->common).seq_params;
                    if ((((x->e_mbd).is_chroma_ref != true) || (pSVar10->monochrome != '\0')) ||
                       ((((local_b30 & 1) == 0 ||
                         (((x->e_mbd).plane[1].subsampling_x == 0 || (iVar32 + 0x20 <= iVar31)))) &&
                        (((local_b38 & 1) == 0 ||
                         (((x->e_mbd).plane[1].subsampling_y == 0 || (iVar19 + 0x20 <= iVar27)))))))
                       ) {
                      bVar25 = (byte)pSVar10->mib_size_log2;
                      iVar19 = mi_row >> (bVar25 & 0x1f);
                      iVar31 = 4 << (bVar25 & 0x1f);
                      iVar27 = ((iVar20 >> 3) + -1) / iVar31;
                      if ((iVar27 <= iVar19) &&
                         ((iVar32 = (iVar28 >> 3) + -1 >> 6,
                          iVar20 = ((int)(iVar5 + ~uVar26) >> 4) + 1,
                          iVar27 * iVar20 + iVar32 < iVar19 * iVar20 + local_bac &&
                          (iVar32 < (int)((iVar19 - iVar27) * ((0x40 < iVar31) + 5) + local_bac)))))
                      {
                        local_b20->palette_colors[0x10] = 0;
                        local_b20->palette_colors[0x11] = 0;
                        local_b20->palette_colors[0x12] = 0;
                        local_b20->palette_colors[0x13] = 0;
                        local_b20->palette_colors[0x14] = 0;
                        local_b20->palette_colors[0x15] = 0;
                        local_b20->palette_colors[0x16] = 0;
                        local_b20->palette_colors[0x17] = 0;
                        local_b20->palette_colors[8] = 0;
                        local_b20->palette_colors[9] = 0;
                        local_b20->palette_colors[10] = 0;
                        local_b20->palette_colors[0xb] = 0;
                        local_b20->palette_colors[0xc] = 0;
                        local_b20->palette_colors[0xd] = 0;
                        local_b20->palette_colors[0xe] = 0;
                        local_b20->palette_colors[0xf] = 0;
                        local_b20->palette_colors[0] = 0;
                        local_b20->palette_colors[1] = 0;
                        local_b20->palette_colors[2] = 0;
                        local_b20->palette_colors[3] = 0;
                        local_b20->palette_colors[4] = 0;
                        local_b20->palette_colors[5] = 0;
                        local_b20->palette_colors[6] = 0;
                        local_b20->palette_colors[7] = 0;
                        local_b20->palette_size[0] = '\0';
                        local_b20->palette_size[1] = '\0';
                        (local_bb8->filter_intra_mode_info).use_filter_intra = '\0';
                        local_bb8->field_0xa7 = local_bb8->field_0xa7 | 0x80;
                        local_bb8->mode = '\0';
                        local_bb8->uv_mode = '\0';
                        local_bb8->motion_mode = '\0';
                        local_bb8->mv[0].as_mv = dv;
                        (local_bb8->interp_filters).as_int = 0x30003;
                        local_bb8->skip_txfm = '\0';
                        bsize_00 = (BLOCK_SIZE)local_b98;
                        av1_enc_build_inter_predictor
                                  (local_b10,local_b90,mi_row,mi_col,(BUFFER_SET *)0x0,bsize_00,0,
                                   (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2);
                        iVar27 = av1_mv_bit_cost(&dv,&local_be4.as_mv,local_b18->joint_mv,local_b28,
                                                 0x78);
                        iVar27 = av1_txfm_search(cpi,x,bsize_00,&rd_stats_yuv,&rd_stats_y,&local_938
                                                 ,iVar27 + (x->mode_costs).intrabc_cost[1],
                                                 0x7fffffffffffffff);
                        if ((iVar27 != 0) &&
                           (lVar22 = rd_stats_yuv.dist * 0x80 +
                                     ((long)x->rdmult * (long)rd_stats_yuv.rate + 0x100 >> 9),
                           rd_stats_yuv.rdcost = lVar22, lVar22 < local_ba0)) {
                          memcpy(&best_mbmi,local_bb8,0xb0);
                          best_rdstats.zero_rate = rd_stats_yuv.zero_rate;
                          best_rdstats.rate = rd_stats_yuv.rate;
                          best_rdstats.dist = rd_stats_yuv.dist;
                          best_rdstats.rdcost = rd_stats_yuv.rdcost;
                          best_rdstats.sse = rd_stats_yuv.sse;
                          best_rdstats.skip_txfm = rd_stats_yuv.skip_txfm;
                          best_rdstats._33_7_ = rd_stats_yuv._33_7_;
                          __n = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
                          memcpy(best_blk_skip,local_b58,__n);
                          memcpy(best_tx_type_map,(x->e_mbd).tx_type_map,__n);
                          local_ba0 = lVar22;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 == 1);
    memcpy(local_bb8,&best_mbmi,0xb0);
    rd_cost->rate = best_rdstats.rate;
    rd_cost->zero_rate = best_rdstats.zero_rate;
    rd_cost->dist = best_rdstats.dist;
    rd_cost->rdcost = best_rdstats.rdcost;
    rd_cost->sse = best_rdstats.sse;
    rd_cost->skip_txfm = best_rdstats.skip_txfm;
    *(undefined7 *)&rd_cost->field_0x21 = best_rdstats._33_7_;
    memcpy(local_b58,best_blk_skip,(ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height);
    memcpy((x->e_mbd).tx_type_map,best_tx_type_map,(long)ctx->num_4x4_blk);
    lVar22 = local_ba0;
    best_rd = local_b50;
  }
  if (lVar22 < best_rd) {
    (ctx->rd_stats).skip_txfm = local_af0->skip_txfm;
    memcpy(ctx->blk_skip,(x->txfm_search_info).blk_skip,(long)ctx->num_4x4_blk);
  }
  if (rd_cost->rate != 0x7fffffff) {
    memcpy(ctx,*(x->e_mbd).mi,0xb0);
    pMVar8 = *(x->e_mbd).mi;
    bVar30 = pMVar8->ref_frame[0];
    cVar4 = pMVar8->ref_frame[1];
    if ('\0' < cVar4) {
      cVar29 = -1;
      if (cVar4 < '\x05' || '\x04' < (char)bVar30) {
        lVar22 = 0;
        do {
          if ((bVar30 == (&comp_ref0_lut)[lVar22]) && (cVar4 == (&comp_ref1_lut)[lVar22])) {
            cVar29 = (char)lVar22;
            break;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 9);
      }
      if (cVar29 < '\0') {
        bVar30 = (cVar4 * '\x04' + bVar30) - 0xd;
      }
      else {
        bVar30 = cVar29 + 0x14;
      }
    }
    pCVar1 = (x->mbmi_ext).ref_mv_stack[bVar30];
    CVar11 = *pCVar1;
    CVar12 = pCVar1[1];
    pCVar1 = (x->mbmi_ext).ref_mv_stack[bVar30] + 2;
    CVar13 = pCVar1[1];
    (ctx->mbmi_ext_best).ref_mv_stack[2] = *pCVar1;
    (ctx->mbmi_ext_best).ref_mv_stack[3] = CVar13;
    (ctx->mbmi_ext_best).ref_mv_stack[0] = CVar11;
    (ctx->mbmi_ext_best).ref_mv_stack[1] = CVar12;
    *&(ctx->mbmi_ext_best).weight = (x->mbmi_ext).weight[bVar30];
    (ctx->mbmi_ext_best).mode_context = (x->mbmi_ext).mode_context[bVar30];
    (ctx->mbmi_ext_best).ref_mv_count = (x->mbmi_ext).ref_mv_count[bVar30];
    uVar16 = *(undefined8 *)((x->mbmi_ext).global_mvs + 2);
    uVar17 = *(undefined8 *)((x->mbmi_ext).global_mvs + 4);
    uVar18 = *(undefined8 *)((x->mbmi_ext).global_mvs + 6);
    *(undefined8 *)(ctx->mbmi_ext_best).global_mvs = *(undefined8 *)(x->mbmi_ext).global_mvs;
    *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 2) = uVar16;
    *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 4) = uVar17;
    *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 6) = uVar18;
    memcpy(ctx->tx_type_map,(x->e_mbd).tx_type_map,(long)ctx->num_4x4_blk);
  }
  return;
}

Assistant:

void av1_rd_pick_intra_mode_sb(const struct AV1_COMP *cpi, struct macroblock *x,
                               struct RD_STATS *rd_cost, BLOCK_SIZE bsize,
                               PICK_MODE_CONTEXT *ctx, int64_t best_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int num_planes = av1_num_planes(cm);
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  int rate_y = 0, rate_uv = 0, rate_y_tokenonly = 0, rate_uv_tokenonly = 0;
  uint8_t y_skip_txfm = 0, uv_skip_txfm = 0;
  int64_t dist_y = 0, dist_uv = 0;

  ctx->rd_stats.skip_txfm = 0;
  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->use_intrabc = 0;
  mbmi->mv[0].as_int = 0;
  mbmi->skip_mode = 0;

  const int64_t intra_yrd =
      av1_rd_pick_intra_sby_mode(cpi, x, &rate_y, &rate_y_tokenonly, &dist_y,
                                 &y_skip_txfm, bsize, best_rd, ctx);

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  if (intra_yrd < best_rd) {
    // Search intra modes for uv planes if needed
    if (num_planes > 1) {
      // Set up the tx variables for reproducing the y predictions in case we
      // need it for chroma-from-luma.
      if (xd->is_chroma_ref && store_cfl_required_rdo(cm, x)) {
        memcpy(txfm_info->blk_skip, ctx->blk_skip,
               sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
        av1_copy_array(xd->tx_type_map, ctx->tx_type_map, ctx->num_4x4_blk);
      }
      const TX_SIZE max_uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
      av1_rd_pick_intra_sbuv_mode(cpi, x, &rate_uv, &rate_uv_tokenonly,
                                  &dist_uv, &uv_skip_txfm, bsize,
                                  max_uv_tx_size);
    }

    // Intra block is always coded as non-skip
    rd_cost->rate =
        rate_y + rate_uv +
        x->mode_costs.skip_txfm_cost[av1_get_skip_txfm_context(xd)][0];
    rd_cost->dist = dist_y + dist_uv;
    rd_cost->rdcost = RDCOST(x->rdmult, rd_cost->rate, rd_cost->dist);
    rd_cost->skip_txfm = 0;
  } else {
    rd_cost->rate = INT_MAX;
  }

  if (rd_cost->rate != INT_MAX && rd_cost->rdcost < best_rd)
    best_rd = rd_cost->rdcost;
  if (rd_pick_intrabc_mode_sb(cpi, x, ctx, rd_cost, bsize, best_rd) < best_rd) {
    ctx->rd_stats.skip_txfm = mbmi->skip_txfm;
    memcpy(ctx->blk_skip, txfm_info->blk_skip,
           sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
    assert(rd_cost->rate != INT_MAX);
  }
  if (rd_cost->rate == INT_MAX) return;

  ctx->mic = *xd->mi[0];
  av1_copy_mbmi_ext_to_mbmi_ext_frame(&ctx->mbmi_ext_best, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
}